

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveIn::in<chrono::ChVector<double>*>
          (ChArchiveIn *this,
          ChNameValue<std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>_>
          *bVal)

{
  vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_> *pvVar1;
  pointer ppCVar2;
  size_t i;
  ulong uVar3;
  ChVector<double> *element;
  size_t arraysize;
  char idname [20];
  ChVector<double> *local_70;
  size_type local_68;
  ChNameValue<chrono::ChVector<double>_*> local_60;
  char local_48 [24];
  
  pvVar1 = bVal->_value;
  ppCVar2 = (pvVar1->
            super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar1->
      super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppCVar2) {
    (pvVar1->
    super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppCVar2;
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])(this,bVal->_name,&local_68);
  std::vector<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>::resize
            (bVal->_value,local_68);
  for (uVar3 = 0; uVar3 < local_68; uVar3 = uVar3 + 1) {
    sprintf(local_48,"%lu",uVar3);
    local_60._flags = '\0';
    local_60._name = local_48;
    local_60._value = &local_70;
    in<chrono::ChVector<double>>(this,&local_60);
    (bVal->_value->
    super__Vector_base<chrono::ChVector<double>_*,_std::allocator<chrono::ChVector<double>_*>_>).
    _M_impl.super__Vector_impl_data._M_start[uVar3] = local_70;
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])(this,bVal->_name);
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,bVal->_name);
  return;
}

Assistant:

void in     (ChNameValue< std::vector<T> > bVal) {
          bVal.value().clear();
          size_t arraysize;
          this->in_array_pre(bVal.name(), arraysize);
          bVal.value().resize(arraysize);
          for (size_t i = 0; i<arraysize; ++i)
          {
              char idname[20];
              sprintf(idname, "%lu", (unsigned long)i);
              T element;
              ChNameValue< T > array_val(idname, element);
              this->in (array_val);
              bVal.value()[i]=element;
              this->in_array_between(bVal.name());
          }
          this->in_array_end(bVal.name());
      }